

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.c
# Opt level: O2

void sim(void)

{
  _func_Card_ptr_ptr_unsigned_long_ptr *p_Var1;
  _func_Board_ptr_Card_ptr_ptr_unsigned_long *p_Var2;
  _func_MovePack_ptr_Board_ptr *p_Var3;
  Move *pMVar4;
  pthread_t __th;
  undefined8 uVar5;
  long lVar6;
  uchar cardsCount_00;
  int iVar7;
  Results *pRVar8;
  Card **cards;
  Board *pBVar9;
  char *pcVar10;
  MovePack *movePack;
  Results results_00;
  char *pcVar11;
  Results *__newthread;
  ulong uVar12;
  unsigned_long uVar13;
  undefined1 auVar14 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar15 [16];
  undefined1 in_ZMM1 [64];
  Results aRStack_60 [2];
  Results *local_50;
  Results *results;
  unsigned_long local_40;
  unsigned_long cardsCount;
  
  lVar6 = -(gConfig.threadCount * 8 + 0xf & 0xfffffffffffffff0);
  results = (Results *)((long)aRStack_60 + lVar6 + 8);
  *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106d7f;
  pRVar8 = results_create();
  local_40 = 0;
  p_Var1 = (gConfig.game)->deckCreate;
  if (p_Var1 == (_func_Card_ptr_ptr_unsigned_long_ptr *)0x0) {
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106da4;
    cards = game_deckCreate(&local_40);
  }
  else {
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106d9d;
    cards = (*p_Var1)(&local_40);
  }
  if (gConfig.json == true) {
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106dbc;
    printf("{\"deck\":");
    cardsCount_00 = (uchar)local_40;
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106dc8;
    cards_printAsDeck(cards,cardsCount_00);
  }
  uVar13 = local_40;
  p_Var2 = (gConfig.game)->boardCreate;
  *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106dd9;
  pBVar9 = (*p_Var2)(cards,uVar13);
  cardsCount = (unsigned_long)pBVar9;
  *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106de5;
  pBVar9 = board_dup(pBVar9);
  *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106df0;
  free(cards);
  if ((gConfig.json == false) && (gConfig.printSolution == false)) {
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106e0f;
    pcVar10 = comma_print(gConfig.iterationCount);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106e20;
    printf("\x1b[35mTotal Iterations: \x1b[36m%s\x1b[0m\n",pcVar10);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106e29;
    pcVar10 = comma_print(gConfig.maxDepth);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106e3a;
    printf("\x1b[35m   Maximum Depth: \x1b[36m%s\x1b[0m\n",pcVar10);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106e43;
    pcVar10 = comma_print(gConfig.threadCount);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106e54;
    printf("\x1b[35m    Thread Count: \x1b[36m%s\x1b[0m\n",pcVar10);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 10;
    iVar7 = (int)*(undefined8 *)((long)aRStack_60 + lVar6);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106e60;
    putchar(iVar7);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106e75;
    printf("\x1b[35m            Game: \x1b[36m%s\x1b[0m\n",(gConfig.game)->idname);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106e87;
    printf("\x1b[35m            Seed: \x1b[36m%u\x1b[0m\n");
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106e8f;
    putchar(iVar7);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106e9b;
    puts("\x1b[35m           Board: \x1b[0m");
    uVar13 = cardsCount;
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106ea9;
    board_print((Board *)uVar13,false);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106eb1;
    putchar(iVar7);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106ebd;
    puts("\x1b[35m  Starting Moves:\x1b[0m");
    p_Var3 = (gConfig.game)->movePackGet;
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106eca;
    movePack = (*p_Var3)((Board *)uVar13);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106ee0;
    movePack_print((Board *)uVar13,movePack,false);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 1;
    uVar5 = *(undefined8 *)((long)aRStack_60 + lVar6);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106ef1;
    movePack_free(movePack,SUB81(uVar5,0));
    *(undefined8 *)((long)aRStack_60 + lVar6) = 10;
    uVar5 = *(undefined8 *)((long)aRStack_60 + lVar6);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106ef9;
    putchar((int)uVar5);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106f05;
    puts("\x1b[37m        <<<=== \x1b[32mRUNNING\x1b[37m ===>>>\x1b[0m");
  }
  uVar13 = cardsCount;
  auVar15 = in_ZMM1._0_16_;
  auVar14 = in_ZMM0._0_16_;
  if (gConfig.threadCount < 2) {
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106f59;
    results_00.winCount = (unsigned_long)depthFirstThread(uVar13);
  }
  else {
    __newthread = results;
    aRStack_60[1].winCount = (unsigned_long)pRVar8;
    for (uVar12 = 0; uVar13 = cardsCount, results_00.winCount = aRStack_60[1].winCount,
        uVar12 < gConfig.threadCount; uVar12 = uVar12 + 1) {
      *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106f3b;
      iVar7 = pthread_create(&__newthread->winCount,(pthread_attr_t *)0x0,depthFirstThread,
                             (void *)uVar13);
      if (iVar7 != 0) {
        pcVar10 = "Error creating thread %lu!\n";
        goto LAB_001070e1;
      }
      __newthread = __newthread + 1;
    }
    uVar12 = 0;
    while( true ) {
      auVar15 = in_ZMM1._0_16_;
      auVar14 = in_ZMM0._0_16_;
      if (gConfig.threadCount <= uVar12) break;
      __th = results[uVar12].winCount;
      *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1070a1;
      iVar7 = pthread_join(__th,&local_50);
      pRVar8 = local_50;
      if (iVar7 != 0) {
        pcVar10 = "Error joining thread %lu!\n";
LAB_001070e1:
        *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1070ee;
        fprintf(_stderr,pcVar10,uVar12);
        *(undefined8 *)((long)aRStack_60 + lVar6) = 1;
        uVar5 = *(undefined8 *)((long)aRStack_60 + lVar6);
        *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1070f6;
        exit((int)uVar5);
      }
      *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1070b1;
      results_add(pRVar8,(Results *)results_00.winCount);
      pRVar8 = local_50;
      *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1070ba;
      results_free(pRVar8);
      uVar12 = uVar12 + 1;
    }
  }
  if (gConfig.json == false) {
    uVar13 = ((Results *)results_00.winCount)->winCount;
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106f92;
    pcVar10 = comma_print(uVar13);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106fa1;
    pcVar11 = comma_print(gConfig.iterationCount);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106fb8;
    printf("\x1b[35m       Win Count: \x1b[33m%s\x1b[35m out of \x1b[33m%s\x1b[0m\n",pcVar10,pcVar11
          );
    auVar14 = vcvtusi2sd_avx512f(auVar14,((Results *)results_00.winCount)->winCount);
    auVar15 = vcvtusi2sd_avx512f(auVar15,gConfig.iterationCount);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106fdf;
    printf("\x1b[35m  Win Percentage: \x1b[33m%0.4f%%\x1b[0m\n",
           (auVar14._0_8_ / auVar15._0_8_) * 100.0);
  }
  else {
    uVar13 = ((Results *)results_00.winCount)->winCount;
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106f7c;
    printf(",\"seed\":%u,\"wins\":%lu,\"games\":%lu",(ulong)gConfig.seed,uVar13,
           gConfig.iterationCount);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106f88;
    puts("}");
  }
  if ((gConfig.printSolution == true) && (winningMoves != (MovePack *)0x0)) {
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x106fff;
    puts("\nWinning moves:");
    uVar13 = winningMoves->movesCount;
    *(undefined8 *)((long)aRStack_60 + lVar6) = 1;
    uVar5 = *(undefined8 *)((long)aRStack_60 + lVar6);
    do {
      pMVar4 = winningMoves->moves[uVar13 - 1];
      *(undefined8 *)((long)aRStack_60 + lVar6) = 0x107026;
      move_print(pBVar9,pMVar4,SUB81(uVar5,0));
      pMVar4 = winningMoves->moves[uVar13 - 1];
      *(undefined8 *)((long)aRStack_60 + lVar6) = 0x10703e;
      board_moveMake(pBVar9,pMVar4);
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 1;
    uVar5 = *(undefined8 *)((long)aRStack_60 + lVar6);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x107052;
    movePack_free(winningMoves,SUB81(uVar5,0));
  }
  uVar13 = cardsCount;
  *(undefined8 *)((long)aRStack_60 + lVar6) = 0x10705e;
  board_free((Board *)uVar13);
  *(undefined8 *)((long)aRStack_60 + lVar6) = 0x107066;
  board_free(pBVar9);
  *(undefined8 *)((long)aRStack_60 + lVar6) = 0x10706e;
  results_free((Results *)results_00.winCount);
  return;
}

Assistant:

void sim(void)
{
	unsigned long i;
	pthread_t threads[gConfig.threadCount];
	Board * startBoard;
	Board * winningStartBoard;
	Results * results;
	Results * totalResults = results_create();
	Card ** cards;
	MovePack * movePack;
	unsigned long cardsCount=0;

	if(gConfig.game->deckCreate==0)
		cards = game_deckCreate(&cardsCount);
	else
		cards = gConfig.game->deckCreate(&cardsCount);

	if(gConfig.json)
	{
		printf("{\"deck\":");
		cards_printAsDeck(cards, cardsCount);
	}

	startBoard = gConfig.game->boardCreate(cards, cardsCount);
	winningStartBoard = board_dup(startBoard);
	free(cards);
	
	// Debug section for new game
	/*board_print(startBoard, false);
	printf("====\n");
	unsigned char movesToMake[] = {0,0,1,1,0,1,1,0,0,0,0,0,0,1};
	for(i=0;i<sizeof(movesToMake);i++)
	{
		board_moveMake(startBoard, gConfig.game->movePackGet(startBoard)->moves[movesToMake[i]]);
	}
	board_print(startBoard, false);
	movePack_print(startBoard, gConfig.game->movePackGet(startBoard), false);
	exit(0);*/

	if(!gConfig.json && !gConfig.printSolution)
	{
		printf(C_MAGENTA "Total Iterations: " C_CYAN "%s" C_RESET "\n", comma_print(gConfig.iterationCount));
		printf(C_MAGENTA "   Maximum Depth: " C_CYAN "%s" C_RESET "\n", comma_print(gConfig.maxDepth));
		printf(C_MAGENTA "    Thread Count: " C_CYAN "%s" C_RESET "\n", comma_print(gConfig.threadCount));
		printf("\n");
		printf(C_MAGENTA "            Game: " C_CYAN "%s" C_RESET "\n", gConfig.game->idname);
		printf(C_MAGENTA "            Seed: " C_CYAN "%u" C_RESET "\n", gConfig.seed);
		printf("\n");
		printf(C_MAGENTA "           Board: " C_RESET "\n");
		board_print(startBoard, false);
		printf("\n");
		printf(C_MAGENTA "  Starting Moves:" C_RESET "\n");
		movePack = gConfig.game->movePackGet(startBoard);
		movePack_print(startBoard, movePack, false);
		movePack_free(movePack, true);
		printf("\n");

		printf(C_WHITE "        <<<=== " C_GREEN "RUNNING" C_WHITE " ===>>>" C_RESET "\n");
	}

	if(gConfig.threadCount>1)
	{
		for(i=0;i<gConfig.threadCount;i++)
		{
			if(pthread_create(&threads[i], 0, depthFirstThread, startBoard)!=0)
			{
				fprintf(stderr, "Error creating thread %lu!\n", i);
				exit(EXIT_FAILURE);
			}
		}
		
		for(i=0;i<gConfig.threadCount;i++)
		{
			if(pthread_join(threads[i], (void **)&results)!=0)
			{
				fprintf(stderr, "Error joining thread %lu!\n", i);
				exit(EXIT_FAILURE);
			}

			results_add(results, totalResults);
			results_free(results);
		}
	}
	else
	{
		totalResults = depthFirstThread(startBoard);
	}


	if(!gConfig.json)
	{
		printf(C_MAGENTA "       Win Count: " C_YELLOW "%s" C_MAGENTA " out of " C_YELLOW "%s" C_RESET "\n", comma_print(totalResults->winCount), comma_print(gConfig.iterationCount));
		printf(C_MAGENTA "  Win Percentage: " C_YELLOW "%0.4f%%" C_RESET "\n", ((double)totalResults->winCount/(double)gConfig.iterationCount)*100);
	}
	else
	{
		printf(",\"seed\":%u,\"wins\":%lu,\"games\":%lu", gConfig.seed, totalResults->winCount, gConfig.iterationCount);
		printf("}\n");
	}

	if(gConfig.printSolution && winningMoves!=0)
	{
		printf("\nWinning moves:\n");
		i = winningMoves->movesCount-1;
		do
		{
			//board_print(winningStartBoard, false);
			move_print(winningStartBoard, winningMoves->moves[i], true);
			board_moveMake(winningStartBoard, winningMoves->moves[i]);
			if(i==0)
				break;

			i--;
		} while(true);

		movePack_free(winningMoves, true);
	}

	board_free(startBoard);
	board_free(winningStartBoard);
	results_free(totalResults);
}